

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen8CachePolicy.cpp
# Opt level: O1

bool __thiscall
GmmLib::GmmGen8CachePolicy::SelectNewPATIdx
          (GmmGen8CachePolicy *this,GMM_GFX_MEMORY_TYPE WantedMT,GMM_GFX_TARGET_CACHE WantedTC,
          GMM_GFX_MEMORY_TYPE MT1,GMM_GFX_TARGET_CACHE TC1,GMM_GFX_MEMORY_TYPE MT2,
          GMM_GFX_TARGET_CACHE TC2)

{
  if (MT1 == WantedMT) {
    return (WantedTC == TC2 && WantedMT == MT2) && WantedTC != TC1;
  }
  return MT2 == GMM_GFX_UC_WITH_FENCE || MT2 == WantedMT;
}

Assistant:

bool GmmLib::GmmGen8CachePolicy::SelectNewPATIdx(GMM_GFX_MEMORY_TYPE WantedMT, GMM_GFX_TARGET_CACHE WantedTC,
                                                 GMM_GFX_MEMORY_TYPE MT1, GMM_GFX_TARGET_CACHE TC1,
                                                 GMM_GFX_MEMORY_TYPE MT2, GMM_GFX_TARGET_CACHE TC2)
{
    bool SelectPAT2 = false;

    // select on Memory Type
    if(MT1 != WantedMT)
    {
        if(MT2 == WantedMT || MT2 == GMM_GFX_UC_WITH_FENCE)
        {
            SelectPAT2 = true;
        }
        goto EXIT;
    }

    // select on Target Cache
    if(WantedTC != TC1)
    {
        if(WantedMT == MT2 && WantedTC == TC2)
        {
            SelectPAT2 = true;
        }
        goto EXIT;
    }

EXIT:
    return SelectPAT2;
}